

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O0

Action * new_Action(Grammar *g,int akind,Term *aterm,Rule *arule,State *astate)

{
  uint uVar1;
  uint uVar2;
  Action *__s;
  Action *a;
  State *astate_local;
  Rule *arule_local;
  Term *aterm_local;
  int akind_local;
  Grammar *g_local;
  
  __s = (Action *)malloc(0x30);
  memset(__s,0,0x30);
  __s->kind = akind;
  __s->term = aterm;
  __s->rule = arule;
  __s->state = astate;
  uVar1 = g->action_count;
  g->action_count = uVar1 + 1;
  __s->index = uVar1;
  if ((g->actions).v == (Action **)0x0) {
    (g->actions).v = (g->actions).e;
    uVar2 = (g->actions).n;
    (g->actions).n = uVar2 + 1;
    (g->actions).e[uVar2] = __s;
  }
  else {
    if ((g->actions).v == (g->actions).e) {
      if ((g->actions).n < 3) {
        uVar2 = (g->actions).n;
        (g->actions).n = uVar2 + 1;
        (g->actions).v[uVar2] = __s;
        return __s;
      }
    }
    else if (((g->actions).n & 7) != 0) {
      uVar2 = (g->actions).n;
      (g->actions).n = uVar2 + 1;
      (g->actions).v[uVar2] = __s;
      return __s;
    }
    vec_add_internal(&g->actions,__s);
  }
  return __s;
}

Assistant:

static Action *new_Action(Grammar *g, int akind, Term *aterm, Rule *arule, State *astate) {
  Action *a = MALLOC(sizeof(Action));
  memset(a, 0, sizeof(Action));
  a->kind = akind;
  a->term = aterm;
  a->rule = arule;
  a->state = astate;
  a->index = g->action_count++;
  vec_add(&g->actions, a);
  return a;
}